

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void * fs_create_serializer
                 (char *directory,int directory_length,char *prefix,int prefix_length,char openmode)

{
  ulong uVar1;
  ostream *poVar2;
  Serializer *this;
  Serializer *pSerializer;
  SerializerOpenMode mode;
  string prefix_str;
  allocator local_49;
  undefined1 local_48 [8];
  string directory_str;
  char openmode_local;
  int prefix_length_local;
  char *prefix_local;
  int directory_length_local;
  char *directory_local;
  
  directory_str.field_2._M_local_buf[0xb] = openmode;
  directory_str.field_2._12_4_ = prefix_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,directory,(long)directory_length,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar1 = (ulong)(int)directory_str.field_2._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&mode,prefix,uVar1,(allocator *)((long)&pSerializer + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pSerializer + 7));
  if (directory_str.field_2._M_local_buf[0xb] == 'a') {
    pSerializer._0_4_ = SerializerOpenModeAppend;
  }
  else if (directory_str.field_2._M_local_buf[0xb] == 'r') {
    pSerializer._0_4_ = SerializerOpenModeRead;
  }
  else {
    if (directory_str.field_2._M_local_buf[0xb] != 'w') {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error: openmode \"");
      poVar2 = std::operator<<(poVar2,directory_str.field_2._M_local_buf[0xb]);
      std::operator<<(poVar2,"\" not supported\n");
      exit(-1);
    }
    pSerializer._0_4_ = SerializerOpenModeWrite;
  }
  this = (Serializer *)operator_new(0xe8);
  ser::Serializer::Serializer(this);
  ser::Serializer::Init(this,(string *)local_48,(string *)&mode,(SerializerOpenMode)pSerializer);
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::~string((string *)local_48);
  return this;
}

Assistant:

void* fs_create_serializer(const char* directory, int directory_length,
                           const char* prefix, int prefix_length,
                           char openmode)
{
    std::string directory_str(directory, directory_length);
    std::string prefix_str(prefix, prefix_length);

    SerializerOpenMode mode;
    switch(openmode)
    {
        case 'r':
            mode = SerializerOpenModeRead;
            break;
        case 'w':
            mode = SerializerOpenModeWrite;
            break;
        case 'a':
            mode = SerializerOpenModeAppend;
            break;
        default:
            std::cerr << "Error: openmode \"" << openmode << "\" not supported\n";
            std::exit(-1);
    }

    // Create serializer
    Serializer* pSerializer = new Serializer;
    pSerializer->Init(directory_str, prefix_str, mode);

    return reinterpret_cast<void*>(pSerializer);
}